

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opcodes_llvm_builtins.cpp
# Opt level: O2

bool dxil_spv::emit_compare_instruction(Impl *impl,CmpInst *instruction)

{
  Predicate PVar1;
  uint uVar2;
  Op OVar3;
  Id IVar4;
  Operation *this;
  Builder *pBVar5;
  LoggingCallback p_Var6;
  void *pvVar7;
  Operation *pOVar8;
  Operation *pOVar9;
  Type *pTVar10;
  Operation *this_00;
  Value *pVVar11;
  bool bVar12;
  Op op;
  Id local_1040;
  Id local_103c;
  char buffer [4096];
  
  PVar1 = LLVMBC::CmpInst::getPredicate(instruction);
  switch(PVar1) {
  case FCMP_FALSE:
    pBVar5 = Converter::Impl::builder(impl);
    bVar12 = false;
    goto LAB_0014a003;
  case FCMP_OEQ:
    op = OpFOrdEqual;
    break;
  case FCMP_OGT:
    op = OpFOrdGreaterThan;
    break;
  case FCMP_OGE:
    op = OpFOrdGreaterThanEqual;
    break;
  case FCMP_OLT:
    op = OpFOrdLessThan;
    break;
  case FCMP_OLE:
    op = OpFOrdLessThanEqual;
    break;
  case FCMP_ONE:
    op = OpFOrdNotEqual;
    break;
  case FCMP_ORD:
    pBVar5 = Converter::Impl::builder(impl);
    IVar4 = spv::Builder::makeBoolType(pBVar5);
    pOVar8 = Converter::Impl::allocate(impl,OpIsNan,IVar4);
    pVVar11 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,0);
    IVar4 = Converter::Impl::get_id_for_value(impl,pVVar11,0);
    Operation::add_id(pOVar8,IVar4);
    Converter::Impl::add(impl,pOVar8,false);
    pBVar5 = Converter::Impl::builder(impl);
    IVar4 = spv::Builder::makeBoolType(pBVar5);
    pOVar9 = Converter::Impl::allocate(impl,OpIsNan,IVar4);
    pVVar11 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,1);
    IVar4 = Converter::Impl::get_id_for_value(impl,pVVar11,0);
    Operation::add_id(pOVar9,IVar4);
    Converter::Impl::add(impl,pOVar9,false);
    pBVar5 = Converter::Impl::builder(impl);
    IVar4 = spv::Builder::makeBoolType(pBVar5);
    this = Converter::Impl::allocate(impl,OpLogicalOr,IVar4);
    local_1040 = pOVar8->id;
    buffer._0_8_ = &local_1040;
    local_103c = pOVar9->id;
    buffer[8] = '\x02';
    buffer[9] = '\0';
    buffer[10] = '\0';
    buffer[0xb] = '\0';
    buffer[0xc] = '\0';
    buffer[0xd] = '\0';
    buffer[0xe] = '\0';
    buffer[0xf] = '\0';
    Operation::add_ids(this,(initializer_list<unsigned_int> *)buffer);
    Converter::Impl::add(impl,this,false);
    this_00 = Converter::Impl::allocate(impl,OpLogicalNot,(Value *)instruction);
    Operation::add_id(this_00,this->id);
    goto LAB_0014a221;
  case FCMP_UNO:
    pBVar5 = Converter::Impl::builder(impl);
    IVar4 = spv::Builder::makeBoolType(pBVar5);
    pOVar8 = Converter::Impl::allocate(impl,OpIsNan,IVar4);
    pVVar11 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,0);
    IVar4 = Converter::Impl::get_id_for_value(impl,pVVar11,0);
    Operation::add_id(pOVar8,IVar4);
    Converter::Impl::add(impl,pOVar8,false);
    pBVar5 = Converter::Impl::builder(impl);
    IVar4 = spv::Builder::makeBoolType(pBVar5);
    pOVar9 = Converter::Impl::allocate(impl,OpIsNan,IVar4);
    pVVar11 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,1);
    IVar4 = Converter::Impl::get_id_for_value(impl,pVVar11,0);
    Operation::add_id(pOVar9,IVar4);
    Converter::Impl::add(impl,pOVar9,false);
    this_00 = Converter::Impl::allocate(impl,OpLogicalOr,(Value *)instruction);
    local_1040 = pOVar8->id;
    buffer._0_8_ = &local_1040;
    local_103c = pOVar9->id;
    buffer[8] = '\x02';
    buffer[9] = '\0';
    buffer[10] = '\0';
    buffer[0xb] = '\0';
    buffer[0xc] = '\0';
    buffer[0xd] = '\0';
    buffer[0xe] = '\0';
    buffer[0xf] = '\0';
    Operation::add_ids(this_00,(initializer_list<unsigned_int> *)buffer);
    goto LAB_0014a221;
  case FCMP_UEQ:
    op = OpFUnordEqual;
    break;
  case FCMP_UGT:
    op = OpFUnordGreaterThan;
    break;
  case FCMP_UGE:
    op = OpFUnordGreaterThanEqual;
    break;
  case FCMP_ULT:
    op = OpFUnordLessThan;
    break;
  case FCMP_ULE:
    op = OpFUnordLessThanEqual;
    break;
  case FCMP_UNE:
    op = OpFUnordNotEqual;
    break;
  case FCMP_TRUE:
    pBVar5 = Converter::Impl::builder(impl);
    bVar12 = true;
LAB_0014a003:
    IVar4 = spv::Builder::makeBoolConstant(pBVar5,bVar12,false);
    Converter::Impl::rewrite_value(impl,(Value *)instruction,IVar4);
    return true;
  default:
    p_Var6 = get_thread_log_callback();
    if (p_Var6 == (LoggingCallback)0x0) {
      fwrite("[ERROR]: Unknown CmpInst predicate.\n",0x24,1,_stderr);
      fflush(_stderr);
    }
    else {
      builtin_strncpy(buffer + 0x10,"predicate.\n",0xc);
      builtin_strncpy(buffer,"Unknown CmpInst ",0x10);
      pvVar7 = get_thread_log_callback_userdata();
      (*p_Var6)(pvVar7,Error,buffer);
    }
    return false;
  case ICMP_EQ:
    pVVar11 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,0);
    pTVar10 = LLVMBC::Value::getType(pVVar11);
    uVar2 = LLVMBC::Type::getIntegerBitWidth(pTVar10);
    OVar3 = OpLogicalEqual;
    op = OpIEqual;
    goto LAB_0014a1a8;
  case ICMP_NE:
    pVVar11 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,0);
    pTVar10 = LLVMBC::Value::getType(pVVar11);
    uVar2 = LLVMBC::Type::getIntegerBitWidth(pTVar10);
    OVar3 = OpLogicalNotEqual;
    op = OpINotEqual;
LAB_0014a1a8:
    bVar12 = false;
    if (uVar2 == 1) {
      op = OVar3;
    }
    goto LAB_0014a1b4;
  case ICMP_UGT:
    op = OpUGreaterThan;
    break;
  case ICMP_UGE:
    op = OpUGreaterThanEqual;
    break;
  case ICMP_ULT:
    op = OpULessThan;
    break;
  case ICMP_ULE:
    op = OpULessThanEqual;
    break;
  case ICMP_SGT:
    bVar12 = true;
    op = OpSGreaterThan;
    goto LAB_0014a1b4;
  case ICMP_SGE:
    bVar12 = true;
    op = OpSGreaterThanEqual;
    goto LAB_0014a1b4;
  case ICMP_SLT:
    bVar12 = true;
    op = OpSLessThan;
    goto LAB_0014a1b4;
  case ICMP_SLE:
    bVar12 = true;
    op = OpSLessThanEqual;
    goto LAB_0014a1b4;
  }
  bVar12 = false;
LAB_0014a1b4:
  this_00 = Converter::Impl::allocate(impl,op,(Value *)instruction);
  pVVar11 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,0);
  IVar4 = build_naturally_extended_value(impl,pVVar11,bVar12);
  pVVar11 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,1);
  local_103c = build_naturally_extended_value(impl,pVVar11,bVar12);
  buffer._0_8_ = &local_1040;
  buffer[8] = '\x02';
  buffer[9] = '\0';
  buffer[10] = '\0';
  buffer[0xb] = '\0';
  buffer[0xc] = '\0';
  buffer[0xd] = '\0';
  buffer[0xe] = '\0';
  buffer[0xf] = '\0';
  local_1040 = IVar4;
  Operation::add_ids(this_00,(initializer_list<unsigned_int> *)buffer);
LAB_0014a221:
  Converter::Impl::add(impl,this_00,false);
  return true;
}

Assistant:

bool emit_compare_instruction(Converter::Impl &impl, const llvm::CmpInst *instruction)
{
	bool signed_input = false;
	spv::Op opcode;

	switch (instruction->getPredicate())
	{
	case llvm::CmpInst::Predicate::FCMP_OEQ:
		opcode = spv::OpFOrdEqual;
		break;

	case llvm::CmpInst::Predicate::FCMP_UEQ:
		opcode = spv::OpFUnordEqual;
		break;

	case llvm::CmpInst::Predicate::FCMP_OGT:
		opcode = spv::OpFOrdGreaterThan;
		break;

	case llvm::CmpInst::Predicate::FCMP_UGT:
		opcode = spv::OpFUnordGreaterThan;
		break;

	case llvm::CmpInst::Predicate::FCMP_OGE:
		opcode = spv::OpFOrdGreaterThanEqual;
		break;

	case llvm::CmpInst::Predicate::FCMP_UGE:
		opcode = spv::OpFUnordGreaterThanEqual;
		break;

	case llvm::CmpInst::Predicate::FCMP_OLT:
		opcode = spv::OpFOrdLessThan;
		break;

	case llvm::CmpInst::Predicate::FCMP_ULT:
		opcode = spv::OpFUnordLessThan;
		break;

	case llvm::CmpInst::Predicate::FCMP_OLE:
		opcode = spv::OpFOrdLessThanEqual;
		break;

	case llvm::CmpInst::Predicate::FCMP_ULE:
		opcode = spv::OpFUnordLessThanEqual;
		break;

	case llvm::CmpInst::Predicate::FCMP_ONE:
		opcode = spv::OpFOrdNotEqual;
		break;

	case llvm::CmpInst::Predicate::FCMP_UNE:
		opcode = spv::OpFUnordNotEqual;
		break;

	case llvm::CmpInst::Predicate::FCMP_FALSE:
	{
		// Why on earth is this a thing ...
		impl.rewrite_value(instruction, impl.builder().makeBoolConstant(false));
		return true;
	}

	case llvm::CmpInst::Predicate::FCMP_TRUE:
	{
		// Why on earth is this a thing ...
		impl.rewrite_value(instruction, impl.builder().makeBoolConstant(true));
		return true;
	}

	case llvm::CmpInst::Predicate::ICMP_EQ:
		if (instruction->getOperand(0)->getType()->getIntegerBitWidth() == 1)
			opcode = spv::OpLogicalEqual;
		else
			opcode = spv::OpIEqual;
		break;

	case llvm::CmpInst::Predicate::ICMP_NE:
		if (instruction->getOperand(0)->getType()->getIntegerBitWidth() == 1)
			opcode = spv::OpLogicalNotEqual;
		else
			opcode = spv::OpINotEqual;
		break;

	case llvm::CmpInst::Predicate::ICMP_SLT:
		opcode = spv::OpSLessThan;
		signed_input = true;
		break;

	case llvm::CmpInst::Predicate::ICMP_SLE:
		opcode = spv::OpSLessThanEqual;
		signed_input = true;
		break;

	case llvm::CmpInst::Predicate::ICMP_SGT:
		opcode = spv::OpSGreaterThan;
		signed_input = true;
		break;

	case llvm::CmpInst::Predicate::ICMP_SGE:
		opcode = spv::OpSGreaterThanEqual;
		signed_input = true;
		break;

	case llvm::CmpInst::Predicate::ICMP_ULT:
		opcode = spv::OpULessThan;
		break;

	case llvm::CmpInst::Predicate::ICMP_ULE:
		opcode = spv::OpULessThanEqual;
		break;

	case llvm::CmpInst::Predicate::ICMP_UGT:
		opcode = spv::OpUGreaterThan;
		break;

	case llvm::CmpInst::Predicate::ICMP_UGE:
		opcode = spv::OpUGreaterThanEqual;
		break;

	case llvm::CmpInst::Predicate::FCMP_UNO:
	{
		Operation *first_op = impl.allocate(spv::OpIsNan, impl.builder().makeBoolType());
		first_op->add_id(impl.get_id_for_value(instruction->getOperand(0)));
		impl.add(first_op);

		Operation *second_op = impl.allocate(spv::OpIsNan, impl.builder().makeBoolType());
		second_op->add_id(impl.get_id_for_value(instruction->getOperand(1)));
		impl.add(second_op);

		Operation *op = impl.allocate(spv::OpLogicalOr, instruction);
		op->add_ids({ first_op->id, second_op->id });
		impl.add(op);
		return true;
	}

	case llvm::CmpInst::Predicate::FCMP_ORD:
	{
		Operation *first_op = impl.allocate(spv::OpIsNan, impl.builder().makeBoolType());
		first_op->add_id(impl.get_id_for_value(instruction->getOperand(0)));
		impl.add(first_op);

		Operation *second_op = impl.allocate(spv::OpIsNan, impl.builder().makeBoolType());
		second_op->add_id(impl.get_id_for_value(instruction->getOperand(1)));
		impl.add(second_op);

		Operation *unordered_op = impl.allocate(spv::OpLogicalOr, impl.builder().makeBoolType());
		unordered_op->add_ids({ first_op->id, second_op->id });
		impl.add(unordered_op);

		Operation *op = impl.allocate(spv::OpLogicalNot, instruction);
		op->add_id(unordered_op->id);
		impl.add(op);
		return true;
	}

	default:
		LOGE("Unknown CmpInst predicate.\n");
		return false;
	}

	Operation *op = impl.allocate(opcode, instruction);

	uint32_t id0 = build_naturally_extended_value(impl, instruction->getOperand(0), signed_input);
	uint32_t id1 = build_naturally_extended_value(impl, instruction->getOperand(1), signed_input);
	op->add_ids({ id0, id1 });

	impl.add(op);
	return true;
}